

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,DataReader *dr)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  long *in_RSI;
  char *in_RDI;
  float fVar5;
  bool is_float_1;
  int nscan_1;
  char vstr_1 [16];
  int *ptr_1;
  float *ptr;
  bool is_float;
  char vstr [16];
  int j;
  int nscan;
  int len;
  bool is_array;
  int id;
  Allocator *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  Mat *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffa0;
  byte in_stack_ffffffffffffffa7;
  undefined1 local_58 [28];
  int local_3c;
  int local_38;
  int local_34;
  undefined1 local_2d;
  uint local_2c;
  long *local_28;
  ParamDict *in_stack_fffffffffffffff0;
  
  local_28 = in_RSI;
  clear(in_stack_fffffffffffffff0);
  local_2c = 0;
  while( true ) {
    iVar3 = (**(code **)(*local_28 + 0x10))(local_28,"%d=",&local_2c);
    if (iVar3 != 1) {
      return 0;
    }
    local_2d = (int)local_2c < -0x5b03;
    if ((bool)local_2d) {
      local_2c = 0xffffa4fc - local_2c;
    }
    if (0x1f < (int)local_2c) break;
    if ((bool)local_2d) {
      local_34 = 0;
      local_38 = (**(code **)(*local_28 + 0x10))(local_28,"%d",&local_34);
      if (local_38 != 1) {
        fprintf(_stderr,"ParamDict read array length failed");
        fprintf(_stderr,"\n");
        return -1;
      }
      Mat::create(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,
                  in_stack_ffffffffffffff78);
      for (local_3c = 0; local_3c < local_34; local_3c = local_3c + 1) {
        local_38 = (**(code **)(*local_28 + 0x10))(local_28,",%15[^,\n ]",local_58);
        if (local_38 != 1) {
          fprintf(_stderr,"ParamDict read array element failed");
          fprintf(_stderr,"\n");
          return -1;
        }
        in_stack_ffffffffffffffa7 = vstr_is_float(in_RDI);
        if ((bool)in_stack_ffffffffffffffa7) {
          lVar1 = *(long *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x50 + 8);
          fVar5 = vstr_to_float((char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0
                                                ));
          *(float *)(lVar1 + (long)local_3c * 4) = fVar5;
        }
        else {
          in_stack_ffffffffffffff90 =
               *(Mat **)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x50 + 8);
          local_38 = __isoc99_sscanf(local_58,"%d",
                                     (long)&in_stack_ffffffffffffff90->data + (long)local_3c * 4);
          if (local_38 != 1) {
            fprintf(_stderr,"ParamDict parse array element failed");
            fprintf(_stderr,"\n");
            return -1;
          }
          local_38 = 1;
        }
        uVar4 = 5;
        if ((in_stack_ffffffffffffffa7 & 1) != 0) {
          uVar4 = 6;
        }
        *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x50) = uVar4;
      }
    }
    else {
      iVar3 = (**(code **)(*local_28 + 0x10))(local_28,"%15s",&stack0xffffffffffffff78);
      if (iVar3 != 1) {
        fprintf(_stderr,"ParamDict read value failed");
        fprintf(_stderr,"\n");
        return -1;
      }
      bVar2 = vstr_is_float(in_RDI);
      if (bVar2) {
        fVar5 = vstr_to_float((char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0))
        ;
        *(float *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x50 + 4) = fVar5;
      }
      else {
        iVar3 = __isoc99_sscanf(&stack0xffffffffffffff78,"%d",
                                *(long *)(in_RDI + 8) + (long)(int)local_2c * 0x50 + 4);
        if (iVar3 != 1) {
          fprintf(_stderr,"ParamDict parse value failed");
          fprintf(_stderr,"\n");
          return -1;
        }
      }
      uVar4 = 2;
      if (bVar2) {
        uVar4 = 3;
      }
      *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x50) = uVar4;
    }
  }
  fprintf(_stderr,"id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)",
          (ulong)local_2c,0x20);
  fprintf(_stderr,"\n");
  return -1;
}

Assistant:

int ParamDict::load_param(const DataReader& dr)
{
    clear();

    //     0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (dr.scan("%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (id >= NCNN_MAX_PARAM_COUNT)
        {
            NCNN_LOGE("id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)", id, NCNN_MAX_PARAM_COUNT);
            return -1;
        }

        if (is_array)
        {
            int len = 0;
            int nscan = dr.scan("%d", &len);
            if (nscan != 1)
            {
                NCNN_LOGE("ParamDict read array length failed");
                return -1;
            }

            d->params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = dr.scan(",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict read array element failed");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = d->params[id].v;
                    ptr[j] = vstr_to_float(vstr);
                }
                else
                {
                    int* ptr = d->params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                    if (nscan != 1)
                    {
                        NCNN_LOGE("ParamDict parse array element failed");
                        return -1;
                    }
                }

                d->params[id].type = is_float ? 6 : 5;
            }
        }
        else
        {
            char vstr[16];
            int nscan = dr.scan("%15s", vstr);
            if (nscan != 1)
            {
                NCNN_LOGE("ParamDict read value failed");
                return -1;
            }

            bool is_float = vstr_is_float(vstr);

            if (is_float)
            {
                d->params[id].f = vstr_to_float(vstr);
            }
            else
            {
                nscan = sscanf(vstr, "%d", &d->params[id].i);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict parse value failed");
                    return -1;
                }
            }

            d->params[id].type = is_float ? 3 : 2;
        }
    }

    return 0;
}